

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceptor.cpp
# Opt level: O0

int __thiscall let::Acceptor::listen(Acceptor *this,int __fd,int __n)

{
  EventLoop *this_00;
  int extraout_EAX;
  anon_class_8_1_8991fb9c local_38;
  Task local_30;
  Acceptor *local_10;
  Acceptor *this_local;
  
  this_00 = this->loop_;
  local_38.this = this;
  local_10 = this;
  std::function<void()>::function<let::Acceptor::listen()::__0,void>
            ((function<void()> *)&local_30,&local_38);
  EventLoop::execute(this_00,&local_30,true);
  std::function<void_()>::~function(&local_30);
  return extraout_EAX;
}

Assistant:

void Acceptor::listen()
{
    loop_->execute([=]() {
        evconnlistener_enable(ev_listener_);
        LOG_VERBOSE << "start listen ";
    });
}